

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint filter(uchar *out,uchar *in,uint w,uint h,LodePNGColorMode *info,
           LodePNGEncoderSettings *settings)

{
  int *piVar1;
  uchar filterType;
  byte bVar2;
  undefined4 uVar3;
  uint uVar4;
  uchar *puVar5;
  uchar *puVar6;
  void *pvVar7;
  ulong uVar8;
  LodePNGFilterStrategy LVar9;
  ulong bytewidth;
  ulong uVar10;
  ulong length;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  uchar *puVar19;
  ulong uVar20;
  bool bVar21;
  uchar *local_4e8;
  uchar *local_4e0;
  uchar *dummy;
  long local_4a0;
  size_t size [5];
  uchar *attempt_1 [5];
  uchar *attempt [5];
  
  uVar4 = lodepng_get_bpp(info);
  length = (ulong)(w * uVar4 + 7 >> 3);
  bytewidth = (ulong)(uVar4 + 7 >> 3);
  LVar9 = settings->filter_strategy;
  uVar16 = (ulong)h;
  if ((settings->filter_palette_zero == 0) ||
     ((info->colortype != LCT_PALETTE && (7 < info->bitdepth)))) {
    if (uVar4 == 0) {
      return 0x1f;
    }
    if (LFS_FOUR < LVar9) {
      switch(LVar9) {
      case LFS_MINSUM:
        lVar18 = 0;
        do {
          if (lVar18 == 5) {
            puVar5 = out + 1;
            uVar13 = 0;
            uVar20 = 0;
            local_4e8 = (uchar *)0x0;
            for (uVar14 = 0; uVar14 != uVar16; uVar14 = uVar14 + 1) {
              lVar18 = uVar14 * length;
              for (uVar15 = 0; uVar15 != 5; uVar15 = uVar15 + 1) {
                puVar19 = attempt[uVar15];
                filterScanline(puVar19,in + lVar18,local_4e8,length,bytewidth,(uchar)uVar15);
                uVar8 = 0;
                uVar10 = 0;
                if (uVar15 == 0) {
                  for (; length != uVar10; uVar10 = uVar10 + 1) {
                    uVar8 = uVar8 + puVar19[uVar10];
                  }
                }
                else {
                  for (; length != uVar10; uVar10 = uVar10 + 1) {
                    bVar2 = puVar19[uVar10];
                    uVar4 = bVar2 ^ 0xff;
                    if (-1 < (char)bVar2) {
                      uVar4 = (uint)bVar2;
                    }
                    uVar8 = uVar8 + uVar4;
                  }
                }
                bVar21 = uVar8 < uVar13;
                if (bVar21 || uVar15 == 0) {
                  uVar13 = uVar8;
                }
                if (bVar21 || uVar15 == 0) {
                  uVar20 = uVar15 & 0xff;
                }
              }
              out[(length + 1) * uVar14] = (uchar)uVar20;
              for (uVar15 = 0; length != uVar15; uVar15 = uVar15 + 1) {
                puVar5[uVar15] = attempt[uVar20][uVar15];
              }
              puVar5 = puVar5 + length + 1;
              local_4e8 = in + lVar18;
            }
            for (lVar18 = 0; lVar18 != 5; lVar18 = lVar18 + 1) {
              free(attempt[lVar18]);
            }
            return 0;
          }
          puVar5 = (uchar *)malloc(length);
          attempt[lVar18] = puVar5;
          lVar18 = lVar18 + 1;
        } while (puVar5 != (uchar *)0x0);
        break;
      case LFS_ENTROPY:
        lVar18 = 0;
        do {
          if (lVar18 == 5) {
            puVar5 = out + 1;
            uVar20 = 0;
            uVar14 = 0;
            local_4e0 = (uchar *)0x0;
            for (uVar13 = 0; uVar13 != uVar16; uVar13 = uVar13 + 1) {
              lVar18 = uVar13 * length;
              for (uVar15 = 0; uVar15 != 5; uVar15 = uVar15 + 1) {
                puVar19 = (uchar *)size[uVar15];
                filterScanline(puVar19,in + lVar18,local_4e0,length,bytewidth,(uchar)uVar15);
                for (lVar17 = 0; lVar17 != 0x100; lVar17 = lVar17 + 1) {
                  *(undefined4 *)((long)attempt + lVar17 * 4) = 0;
                }
                for (uVar8 = 0; length != uVar8; uVar8 = uVar8 + 1) {
                  piVar1 = (int *)((long)attempt + (ulong)puVar19[uVar8] * 4);
                  *piVar1 = *piVar1 + 1;
                }
                piVar1 = (int *)((long)attempt + uVar15 * 4);
                *piVar1 = *piVar1 + 1;
                uVar8 = 0;
                for (lVar17 = 0; lVar17 != 0x100; lVar17 = lVar17 + 1) {
                  uVar10 = (ulong)*(uint *)((long)attempt + lVar17 * 4);
                  if (uVar10 == 0) {
                    lVar11 = 0;
                  }
                  else {
                    lVar11 = 0;
                    for (uVar12 = uVar10; 0xffff < uVar12; uVar12 = uVar12 >> 0x10) {
                      lVar11 = lVar11 + uVar10 * 0x10;
                    }
                    for (; 0xff < uVar12; uVar12 = uVar12 >> 8) {
                      lVar11 = lVar11 + uVar10 * 8;
                    }
                    for (; 0xf < uVar12; uVar12 = uVar12 >> 4) {
                      lVar11 = lVar11 + uVar10 * 4;
                    }
                    for (; 1 < uVar12; uVar12 = uVar12 >> 1) {
                      lVar11 = lVar11 + uVar10;
                    }
                  }
                  uVar8 = uVar8 + lVar11;
                }
                if (uVar20 < uVar8 || uVar15 == 0) {
                  uVar14 = uVar15 & 0xffffffff;
                  uVar20 = uVar8;
                }
              }
              out[(length + 1) * uVar13] = (uchar)uVar14;
              for (uVar15 = 0; length != uVar15; uVar15 = uVar15 + 1) {
                puVar5[uVar15] = *(uchar *)(size[uVar14] + uVar15);
              }
              puVar5 = puVar5 + length + 1;
              local_4e0 = in + lVar18;
            }
            for (lVar18 = 0; lVar18 != 5; lVar18 = lVar18 + 1) {
              free((void *)size[lVar18]);
            }
            return 0;
          }
          pvVar7 = malloc(length);
          size[lVar18] = (size_t)pvVar7;
          lVar18 = lVar18 + 1;
        } while (pvVar7 != (void *)0x0);
        break;
      case LFS_BRUTE_FORCE:
        uVar3 = (settings->zlibsettings).use_lz77;
        attempt[1] = *(uchar **)&(settings->zlibsettings).windowsize;
        attempt[2] = *(uchar **)&(settings->zlibsettings).nicematch;
        attempt[0] = (uchar *)CONCAT44(uVar3,1);
        attempt[3] = (uchar *)0x0;
        attempt[4] = (uchar *)0x0;
        lVar18 = 0;
        do {
          if (lVar18 == 5) {
            local_4a0 = length + 1;
            puVar5 = out + 1;
            local_4e0 = (uchar *)0x0;
            uVar20 = 0;
            uVar14 = 0;
            for (uVar13 = 0; uVar13 != uVar16; uVar13 = uVar13 + 1) {
              lVar18 = uVar13 * length;
              lVar17 = 0;
              for (uVar15 = 0; uVar15 != 5; uVar15 = uVar15 + 1) {
                puVar19 = attempt_1[uVar15];
                filterScanline(puVar19,in + lVar18,local_4e0,length,bytewidth,(uchar)uVar15);
                size[uVar15] = 0;
                dummy = (uchar *)0x0;
                zlib_compress(&dummy,(size_t *)((long)size + lVar17),puVar19,length,
                              (LodePNGCompressSettings *)attempt);
                free(dummy);
                if (size[uVar15] < uVar20 || lVar17 == 0) {
                  uVar14 = uVar15 & 0xffffffff;
                  uVar20 = size[uVar15];
                }
                lVar17 = lVar17 + 8;
              }
              out[local_4a0 * uVar13] = (uchar)uVar14;
              for (uVar15 = 0; length != uVar15; uVar15 = uVar15 + 1) {
                puVar5[uVar15] = attempt_1[uVar14][uVar15];
              }
              puVar5 = puVar5 + local_4a0;
              local_4e0 = in + lVar18;
            }
            for (lVar18 = 0; lVar18 != 5; lVar18 = lVar18 + 1) {
              free(attempt_1[lVar18]);
            }
            return 0;
          }
          puVar5 = (uchar *)malloc(length);
          attempt_1[lVar18] = puVar5;
          lVar18 = lVar18 + 1;
        } while (puVar5 != (uchar *)0x0);
        break;
      case LFS_PREDEFINED:
        puVar19 = out + 1;
        puVar5 = (uchar *)0x0;
        for (uVar20 = 0; puVar6 = in, uVar16 != uVar20; uVar20 = uVar20 + 1) {
          filterType = settings->predefined_filters[uVar20];
          puVar19[-1] = filterType;
          filterScanline(puVar19,puVar6,puVar5,length,bytewidth,filterType);
          puVar19 = puVar19 + length + 1;
          in = puVar6 + length;
          puVar5 = puVar6;
        }
        return 0;
      default:
        return 0x58;
      }
      return 0x53;
    }
  }
  else {
    LVar9 = LFS_ZERO;
    if (uVar4 == 0) {
      return 0x1f;
    }
  }
  puVar19 = out + 1;
  puVar5 = (uchar *)0x0;
  while (puVar6 = in, bVar21 = uVar16 != 0, uVar16 = uVar16 - 1, bVar21) {
    puVar19[-1] = (uchar)LVar9;
    filterScanline(puVar19,puVar6,puVar5,length,bytewidth,(uchar)LVar9);
    puVar19 = puVar19 + length + 1;
    in = puVar6 + length;
    puVar5 = puVar6;
  }
  return 0;
}

Assistant:

static unsigned filter(unsigned char* out, const unsigned char* in, unsigned w, unsigned h,
                       const LodePNGColorMode* info, const LodePNGEncoderSettings* settings) {
  /*
  For PNG filter method 0
  out must be a buffer with as size: h + (w * h * bpp + 7u) / 8u, because there are
  the scanlines with 1 extra byte per scanline
  */

  unsigned bpp = lodepng_get_bpp(info);
  /*the width of a scanline in bytes, not including the filter type*/
  size_t linebytes = (w * bpp + 7u) / 8u;
  /*bytewidth is used for filtering, is 1 when bpp < 8, number of bytes per pixel otherwise*/
  size_t bytewidth = (bpp + 7u) / 8u;
  const unsigned char* prevline = 0;
  unsigned x, y;
  unsigned error = 0;
  LodePNGFilterStrategy strategy = settings->filter_strategy;

  /*
  There is a heuristic called the minimum sum of absolute differences heuristic, suggested by the PNG standard:
   *  If the image type is Palette, or the bit depth is smaller than 8, then do not filter the image (i.e.
      use fixed filtering, with the filter None).
   * (The other case) If the image type is Grayscale or RGB (with or without Alpha), and the bit depth is
     not smaller than 8, then use adaptive filtering heuristic as follows: independently for each row, apply
     all five filters and select the filter that produces the smallest sum of absolute values per row.
  This heuristic is used if filter strategy is LFS_MINSUM and filter_palette_zero is true.

  If filter_palette_zero is true and filter_strategy is not LFS_MINSUM, the above heuristic is followed,
  but for "the other case", whatever strategy filter_strategy is set to instead of the minimum sum
  heuristic is used.
  */
  if(settings->filter_palette_zero &&
     (info->colortype == LCT_PALETTE || info->bitdepth < 8)) strategy = LFS_ZERO;

  if(bpp == 0) return 31; /*error: invalid color type*/

  if(strategy >= LFS_ZERO && strategy <= LFS_FOUR) {
    unsigned char type = (unsigned char)strategy;
    for(y = 0; y != h; ++y) {
      size_t outindex = (1 + linebytes) * y; /*the extra filterbyte added to each row*/
      size_t inindex = linebytes * y;
      out[outindex] = type; /*filter type byte*/
      filterScanline(&out[outindex + 1], &in[inindex], prevline, linebytes, bytewidth, type);
      prevline = &in[inindex];
    }
  } else if(strategy == LFS_MINSUM) {
    /*adaptive filtering*/
    size_t sum[5];
    unsigned char* attempt[5]; /*five filtering attempts, one for each filter type*/
    size_t smallest = 0;
    unsigned char type, bestType = 0;

    for(type = 0; type != 5; ++type) {
      attempt[type] = (unsigned char*)lodepng_malloc(linebytes);
      if(!attempt[type]) return 83; /*alloc fail*/
    }

    if(!error) {
      for(y = 0; y != h; ++y) {
        /*try the 5 filter types*/
        for(type = 0; type != 5; ++type) {
          filterScanline(attempt[type], &in[y * linebytes], prevline, linebytes, bytewidth, type);

          /*calculate the sum of the result*/
          sum[type] = 0;
          if(type == 0) {
            for(x = 0; x != linebytes; ++x) sum[type] += (unsigned char)(attempt[type][x]);
          } else {
            for(x = 0; x != linebytes; ++x) {
              /*For differences, each byte should be treated as signed, values above 127 are negative
              (converted to signed char). Filtertype 0 isn't a difference though, so use unsigned there.
              This means filtertype 0 is almost never chosen, but that is justified.*/
              unsigned char s = attempt[type][x];
              sum[type] += s < 128 ? s : (255U - s);
            }
          }

          /*check if this is smallest sum (or if type == 0 it's the first case so always store the values)*/
          if(type == 0 || sum[type] < smallest) {
            bestType = type;
            smallest = sum[type];
          }
        }

        prevline = &in[y * linebytes];

        /*now fill the out values*/
        out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
        for(x = 0; x != linebytes; ++x) out[y * (linebytes + 1) + 1 + x] = attempt[bestType][x];
      }
    }

    for(type = 0; type != 5; ++type) lodepng_free(attempt[type]);
  } else if(strategy == LFS_ENTROPY) {
    size_t sum[5];
    unsigned char* attempt[5]; /*five filtering attempts, one for each filter type*/
    size_t bestSum = 0;
    unsigned type, bestType = 0;
    unsigned count[256];

    for(type = 0; type != 5; ++type) {
      attempt[type] = (unsigned char*)lodepng_malloc(linebytes);
      if(!attempt[type]) return 83; /*alloc fail*/
    }

    for(y = 0; y != h; ++y) {
      /*try the 5 filter types*/
      for(type = 0; type != 5; ++type) {
        filterScanline(attempt[type], &in[y * linebytes], prevline, linebytes, bytewidth, type);
        for(x = 0; x != 256; ++x) count[x] = 0;
        for(x = 0; x != linebytes; ++x) ++count[attempt[type][x]];
        ++count[type]; /*the filter type itself is part of the scanline*/
        sum[type] = 0;
        for(x = 0; x != 256; ++x) {
          sum[type] += count[x] == 0 ? 0 : ilog2(count[x]) * count[x];
        }
        /*check if this is smallest sum (or if type == 0 it's the first case so always store the values)*/
        if(type == 0 || sum[type] > bestSum) {
          bestType = type;
          bestSum = sum[type];
        }
      }

      prevline = &in[y * linebytes];

      /*now fill the out values*/
      out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
      for(x = 0; x != linebytes; ++x) out[y * (linebytes + 1) + 1 + x] = attempt[bestType][x];
    }

    for(type = 0; type != 5; ++type) lodepng_free(attempt[type]);
  } else if(strategy == LFS_PREDEFINED) {
    for(y = 0; y != h; ++y) {
      size_t outindex = (1 + linebytes) * y; /*the extra filterbyte added to each row*/
      size_t inindex = linebytes * y;
      unsigned char type = settings->predefined_filters[y];
      out[outindex] = type; /*filter type byte*/
      filterScanline(&out[outindex + 1], &in[inindex], prevline, linebytes, bytewidth, type);
      prevline = &in[inindex];
    }
  } else if(strategy == LFS_BRUTE_FORCE) {
    /*brute force filter chooser.
    deflate the scanline after every filter attempt to see which one deflates best.
    This is very slow and gives only slightly smaller, sometimes even larger, result*/
    size_t size[5];
    unsigned char* attempt[5]; /*five filtering attempts, one for each filter type*/
    size_t smallest = 0;
    unsigned type = 0, bestType = 0;
    unsigned char* dummy;
    LodePNGCompressSettings zlibsettings = settings->zlibsettings;
    /*use fixed tree on the attempts so that the tree is not adapted to the filtertype on purpose,
    to simulate the true case where the tree is the same for the whole image. Sometimes it gives
    better result with dynamic tree anyway. Using the fixed tree sometimes gives worse, but in rare
    cases better compression. It does make this a bit less slow, so it's worth doing this.*/
    zlibsettings.btype = 1;
    /*a custom encoder likely doesn't read the btype setting and is optimized for complete PNG
    images only, so disable it*/
    zlibsettings.custom_zlib = 0;
    zlibsettings.custom_deflate = 0;
    for(type = 0; type != 5; ++type) {
      attempt[type] = (unsigned char*)lodepng_malloc(linebytes);
      if(!attempt[type]) return 83; /*alloc fail*/
    }
    for(y = 0; y != h; ++y) /*try the 5 filter types*/ {
      for(type = 0; type != 5; ++type) {
        unsigned testsize = (unsigned)linebytes;
        /*if(testsize > 8) testsize /= 8;*/ /*it already works good enough by testing a part of the row*/

        filterScanline(attempt[type], &in[y * linebytes], prevline, linebytes, bytewidth, type);
        size[type] = 0;
        dummy = 0;
        zlib_compress(&dummy, &size[type], attempt[type], testsize, &zlibsettings);
        lodepng_free(dummy);
        /*check if this is smallest size (or if type == 0 it's the first case so always store the values)*/
        if(type == 0 || size[type] < smallest) {
          bestType = type;
          smallest = size[type];
        }
      }
      prevline = &in[y * linebytes];
      out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
      for(x = 0; x != linebytes; ++x) out[y * (linebytes + 1) + 1 + x] = attempt[bestType][x];
    }
    for(type = 0; type != 5; ++type) lodepng_free(attempt[type]);
  }
  else return 88; /* unknown filter strategy */

  return error;
}